

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

bool __thiscall caffe::NetState::MergePartialFromCodedStream(NetState *this,CodedInputStream *input)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  InternalMetadataWithArena *this_01;
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  void *pvVar4;
  Arena *this_02;
  char *data;
  bool bVar5;
  uint32 uVar6;
  uint uVar7;
  string *value;
  Type *pTVar8;
  int64 iVar9;
  UnknownFieldSet *pUVar10;
  int iVar11;
  char cVar12;
  uint uVar13;
  ulong uVar14;
  Rep *pRVar15;
  
  this_00 = &this->stage_;
  this_01 = &this->_internal_metadata_;
LAB_003acc42:
  do {
    pbVar3 = input->buffer_;
    uVar6 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar1 = *pbVar3;
      uVar6 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003acc66;
      input->buffer_ = pbVar3 + 1;
      uVar14 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003acc66:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar14 = 0;
      if (uVar6 - 1 < 0x7f) {
        uVar14 = 0x100000000;
      }
      uVar14 = uVar6 | uVar14;
    }
    uVar13 = (uint)uVar14;
    if ((uVar14 & 0x100000000) != 0) {
      uVar7 = (uint)(uVar14 >> 3) & 0x1fffffff;
      cVar12 = (char)uVar14;
      if (uVar7 == 3) {
        if (cVar12 != '\x1a') goto LAB_003acc88;
        pRVar15 = (this->stage_).super_RepeatedPtrFieldBase.rep_;
        if (pRVar15 == (Rep *)0x0) {
          iVar11 = (this->stage_).super_RepeatedPtrFieldBase.total_size_;
LAB_003acd7a:
          google::protobuf::internal::RepeatedPtrFieldBase::Reserve
                    (&this_00->super_RepeatedPtrFieldBase,iVar11 + 1);
          pRVar15 = (this->stage_).super_RepeatedPtrFieldBase.rep_;
          iVar11 = pRVar15->allocated_size;
LAB_003acd8b:
          pRVar15->allocated_size = iVar11 + 1;
          this_02 = (this_00->super_RepeatedPtrFieldBase).arena_;
          if (this_02 == (Arena *)0x0) {
            value = (string *)operator_new(0x20);
            (value->_M_dataplus)._M_p = (pointer)&value->field_2;
            value->_M_string_length = 0;
            (value->field_2)._M_local_buf[0] = '\0';
          }
          else {
            value = (string *)
                    google::protobuf::Arena::AllocateAligned
                              (this_02,(type_info *)&std::__cxx11::string::typeinfo,0x20);
            (value->_M_dataplus)._M_p = (pointer)&value->field_2;
            value->_M_string_length = 0;
            (value->field_2)._M_local_buf[0] = '\0';
            google::protobuf::Arena::AddListNode
                      (this_02,value,
                       google::protobuf::internal::arena_destruct_object<std::__cxx11::string>);
            pRVar15 = (this->stage_).super_RepeatedPtrFieldBase.rep_;
          }
          iVar11 = (this->stage_).super_RepeatedPtrFieldBase.current_size_;
          (this->stage_).super_RepeatedPtrFieldBase.current_size_ = iVar11 + 1;
          pRVar15->elements[iVar11] = value;
        }
        else {
          iVar2 = (this->stage_).super_RepeatedPtrFieldBase.current_size_;
          iVar11 = pRVar15->allocated_size;
          if (iVar11 <= iVar2) {
            if (iVar11 == (this->stage_).super_RepeatedPtrFieldBase.total_size_) goto LAB_003acd7a;
            goto LAB_003acd8b;
          }
          (this->stage_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
          value = (string *)pRVar15->elements[iVar2];
        }
        bVar5 = google::protobuf::internal::WireFormatLite::ReadBytes(input,value);
        if (!bVar5) {
          return false;
        }
        pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                           (&this_00->super_RepeatedPtrFieldBase,
                            (this->stage_).super_RepeatedPtrFieldBase.current_size_ + -1);
        data = (pTVar8->_M_dataplus)._M_p;
        pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                           (&this_00->super_RepeatedPtrFieldBase,
                            (this->stage_).super_RepeatedPtrFieldBase.current_size_ + -1);
        google::protobuf::internal::WireFormatLite::VerifyUtf8String
                  (data,(int)pTVar8->_M_string_length,PARSE,"caffe.NetState.stage");
      }
      else if (uVar7 == 2) {
        if (cVar12 != '\x10') goto LAB_003acc88;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar1 = *pbVar3;
          uVar14 = (ulong)bVar1;
          uVar6 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_003ace6e;
          input->buffer_ = pbVar3 + 1;
        }
        else {
          uVar6 = 0;
LAB_003ace6e:
          uVar14 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
          if ((long)uVar14 < 0) {
            return false;
          }
        }
        this->level_ = (int32)uVar14;
      }
      else {
        if ((uVar7 != 1) || (cVar12 != '\b')) goto LAB_003acc88;
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar1 = *pbVar3;
          uVar6 = (uint32)bVar1;
          uVar13 = (uint)bVar1;
          if ((char)bVar1 < '\0') goto LAB_003ace88;
          input->buffer_ = pbVar3 + 1;
        }
        else {
          uVar6 = 0;
LAB_003ace88:
          iVar9 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
          uVar13 = (uint)iVar9;
          if (iVar9 < 0) {
            return false;
          }
        }
        if (uVar13 < 2) {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
          this->phase_ = uVar13;
        }
        else {
          pvVar4 = (this_01->
                   super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                   ).ptr_;
          if (((ulong)pvVar4 & 1) == 0) {
            pUVar10 = google::protobuf::internal::
                      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                      ::mutable_unknown_fields_slow
                                (&this_01->
                                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                                );
          }
          else {
            pUVar10 = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
          }
          google::protobuf::UnknownFieldSet::AddVarint(pUVar10,1,(long)(int)uVar13);
        }
      }
      goto LAB_003acc42;
    }
LAB_003acc88:
    if (uVar13 == 0) {
      return true;
    }
    if ((uVar13 & 7) == 4) {
      return true;
    }
    pvVar4 = (this_01->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_;
    if (((ulong)pvVar4 & 1) == 0) {
      pUVar10 = google::protobuf::internal::
                InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                ::mutable_unknown_fields_slow
                          (&this_01->
                            super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                          );
    }
    else {
      pUVar10 = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
    }
    bVar5 = google::protobuf::internal::WireFormat::SkipField(input,uVar13,pUVar10);
    if (!bVar5) {
      return false;
    }
  } while( true );
}

Assistant:

bool NetState::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.NetState)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional .caffe.Phase phase = 1 [default = TEST];
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::caffe::Phase_IsValid(value)) {
            set_phase(static_cast< ::caffe::Phase >(value));
          } else {
            mutable_unknown_fields()->AddVarint(1, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional int32 level = 2 [default = 0];
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          set_has_level();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &level_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated string stage = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_stage()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->stage(this->stage_size() - 1).data(),
            this->stage(this->stage_size() - 1).length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.NetState.stage");
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.NetState)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.NetState)
  return false;
#undef DO_
}